

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int generate_by_descriptor_multisig
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,int flag,
              uchar *script,size_t script_len,size_t *write_len)

{
  miniscript_node_t *node_00;
  void *__base;
  ulong local_80;
  size_t check_len;
  multisig_sort_data_t *sorted_node_array;
  miniscript_node_t *temp_node;
  miniscript_node_t *child;
  uint32_t index;
  uint32_t count;
  size_t offset;
  size_t child_write_len;
  size_t sStack_38;
  int ret;
  size_t script_len_local;
  uchar *script_local;
  int flag_local;
  int32_t derive_child_num_local;
  miniscript_node_t *parent_local;
  miniscript_node_t *node_local;
  
  offset = 0;
  child._4_4_ = 0;
  child._0_4_ = 0;
  node_00 = node->child;
  local_80 = script_len;
  if (0x207 < script_len) {
    local_80 = 0x208;
  }
  if ((node_00 == (miniscript_node_t *)0x0) ||
     ((parent != (miniscript_node_t *)0x0 && (parent->info == (miniscript_item_t *)0x0)))) {
    node_local._4_4_ = -2;
  }
  else {
    sStack_38 = script_len;
    script_len_local = (size_t)script;
    script_local._0_4_ = flag;
    script_local._4_4_ = derive_child_num;
    _flag_local = parent;
    parent_local = node;
    child_write_len._4_4_ =
         generate_script_from_miniscript
                   (node_00,node,derive_child_num,script,script_len,(size_t *)&index);
    node_local._4_4_ = child_write_len._4_4_;
    if (child_write_len._4_4_ == 0) {
      for (sorted_node_array = (multisig_sort_data_t *)node_00->next;
          sorted_node_array != (multisig_sort_data_t *)0x0;
          sorted_node_array = *(multisig_sort_data_t **)sorted_node_array->script) {
        child._4_4_ = child._4_4_ + 1;
      }
      __base = wally_malloc((ulong)child._4_4_ * 0x50);
      if (__base == (void *)0x0) {
        node_local._4_4_ = -3;
      }
      else {
        for (sorted_node_array = (multisig_sort_data_t *)node_00->next;
            sorted_node_array != (multisig_sort_data_t *)0x0;
            sorted_node_array = *(multisig_sort_data_t **)sorted_node_array->script) {
          *(multisig_sort_data_t **)((long)__base + (ulong)(uint)child * 0x50) = sorted_node_array;
          child._0_4_ = (uint)child + 1;
        }
        if (child_write_len._4_4_ == 0) {
          for (child._0_4_ = 0; (uint)child < child._4_4_; child._0_4_ = (uint)child + 1) {
            offset = 0;
            child_write_len._4_4_ =
                 generate_script_from_miniscript
                           (*(miniscript_node_t **)((long)__base + (ulong)(uint)child * 0x50),
                            parent_local,script_local._4_4_,
                            (uchar *)((long)__base + (ulong)(uint)child * 0x50 + 8),0x41,&offset);
            if (child_write_len._4_4_ != 0) break;
            *(int *)((long)__base + (ulong)(uint)child * 0x50 + 0x4c) = (int)offset;
          }
        }
        if (child_write_len._4_4_ == 0) {
          if ((int)script_local == 8) {
            qsort(__base,(ulong)child._4_4_,0x50,compare_multisig_node);
          }
          for (child._0_4_ = 0; (uint)child < child._4_4_; child._0_4_ = (uint)child + 1) {
            if (local_80 < _index + *(uint *)((long)__base + (ulong)(uint)child * 0x50 + 0x4c) + 1)
            {
              child_write_len._4_4_ = -2;
              break;
            }
            memcpy((void *)(script_len_local + _index + 1),
                   (void *)((long)__base + (ulong)(uint)child * 0x50 + 8),
                   (ulong)*(uint *)((long)__base + (ulong)(uint)child * 0x50 + 0x4c));
            *(char *)(script_len_local + _index) =
                 (char)*(undefined4 *)((long)__base + (ulong)(uint)child * 0x50 + 0x4c);
            _index = (*(int *)((long)__base + (ulong)(uint)child * 0x50 + 0x4c) + 1) + _index;
          }
        }
        if (child_write_len._4_4_ == 0) {
          child_write_len._4_4_ =
               generate_script_from_number
                         ((ulong)child._4_4_,_flag_local,(uchar *)(script_len_local + _index),
                          local_80 - _index,&offset);
        }
        if (child_write_len._4_4_ == 0) {
          _index = offset + _index;
          if (local_80 < _index + 1) {
            child_write_len._4_4_ = -2;
          }
          else {
            *(undefined1 *)(script_len_local + _index) = 0xae;
            *write_len = _index + 1;
          }
        }
        wally_free(__base);
        node_local._4_4_ = 0;
      }
    }
  }
  return node_local._4_4_;
}

Assistant:

static int generate_by_descriptor_multisig(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    int flag,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    int ret;
    size_t child_write_len = 0;
    size_t offset;
    uint32_t count = 0;
    uint32_t index = 0;
    struct miniscript_node_t *child = node->child;
    struct miniscript_node_t *temp_node;
    struct multisig_sort_data_t *sorted_node_array;
    size_t check_len = (DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE > script_len) ? script_len : DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE;

    if (!child || (parent && !parent->info))
        return WALLY_EINVAL;

    ret = generate_script_from_miniscript(child, node, derive_child_num, script, script_len, &offset);
    if (ret != WALLY_OK)
        return ret;

    temp_node = child->next;
    while (temp_node != NULL) {
        ++count;
        temp_node = temp_node->next;
    }

    sorted_node_array = (struct multisig_sort_data_t *)wally_malloc(
        count * sizeof(struct multisig_sort_data_t));
    if (!sorted_node_array)
        return WALLY_ENOMEM;

    temp_node = child->next;
    while (temp_node != NULL) {
        sorted_node_array[index].node = temp_node;
        ++index;
        temp_node = temp_node->next;
    }

    if (ret == WALLY_OK) {
        for (index = 0; index < count; ++index) {
            child_write_len = 0;
            ret = generate_script_from_miniscript(
                sorted_node_array[index].node, node, derive_child_num,
                sorted_node_array[index].script,
                sizeof(sorted_node_array[index].script),
                &child_write_len);
            if (ret != WALLY_OK)
                break;
            sorted_node_array[index].script_size = (uint32_t)child_write_len;
        }
    }
    if (ret == WALLY_OK) {
        if (flag == WALLY_SCRIPT_MULTISIG_SORTED) {
            qsort(sorted_node_array, count, sizeof(struct multisig_sort_data_t),
                  compare_multisig_node);
        }
        for (index = 0; index < count; ++index) {
            if (offset + sorted_node_array[index].script_size + 1 > check_len) {
                ret = WALLY_EINVAL;
                break;
            }

            memcpy(&script[offset + 1], sorted_node_array[index].script,
                   sorted_node_array[index].script_size);
            script[offset] = (unsigned char) sorted_node_array[index].script_size;
            offset += sorted_node_array[index].script_size + 1;
        }
    }

    if (ret == WALLY_OK) {
        ret = generate_script_from_number((int64_t)count, parent, &script[offset],
                                          check_len - offset, &child_write_len);
    }

    if (ret == WALLY_OK) {
        offset += child_write_len;
        if (offset + 1 > check_len) {
            ret = WALLY_EINVAL;
        } else {
            script[offset] = OP_CHECKMULTISIG;
            *write_len = offset + 1;
        }
    }
    wally_free(sorted_node_array);
    return WALLY_OK;
}